

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

ReservedRange * __thiscall
google::protobuf::Descriptor::FindReservedRangeContainingNumber(Descriptor *this,int number)

{
  int iVar1;
  ReservedRange *pRVar2;
  int local_20;
  int i;
  int number_local;
  Descriptor *this_local;
  
  local_20 = 0;
  while( true ) {
    iVar1 = reserved_range_count(this);
    if (iVar1 <= local_20) {
      return (ReservedRange *)0x0;
    }
    pRVar2 = reserved_range(this,local_20);
    if ((pRVar2->start <= number) && (pRVar2 = reserved_range(this,local_20), number < pRVar2->end))
    break;
    local_20 = local_20 + 1;
  }
  pRVar2 = reserved_range(this,local_20);
  return pRVar2;
}

Assistant:

const Descriptor::ReservedRange* Descriptor::FindReservedRangeContainingNumber(
    int number) const {
  // TODO(chrisn): Consider a non-linear search.
  for (int i = 0; i < reserved_range_count(); i++) {
    if (number >= reserved_range(i)->start && number < reserved_range(i)->end) {
      return reserved_range(i);
    }
  }
  return nullptr;
}